

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleBlockMap(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  undefined8 uVar2;
  Mark *mark_;
  long *in_RSI;
  Token token;
  Token *in_stack_fffffffffffffec8;
  value type;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  Mark *in_stack_fffffffffffffed8;
  Scanner *in_stack_fffffffffffffee0;
  ParserException *this_00;
  Token *in_stack_fffffffffffffee8;
  allocator *paVar3;
  Token *in_stack_fffffffffffffef0;
  int local_e8;
  allocator local_e1;
  string local_e0 [36];
  int local_bc;
  ParserException local_b8;
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  Mark local_40;
  Mark local_20;
  long *local_10;
  
  local_10 = in_RSI;
  Scanner::pop((Scanner *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf2647b);
  CollectionStack::PushCollectionType
            ((CollectionStack *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (value)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  while( true ) {
    bVar1 = Scanner::empty((Scanner *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0))
    ;
    if (bVar1) {
      local_62 = 1;
      uVar2 = __cxa_allocate_exception(0x40);
      local_40 = Scanner::mark(in_stack_fffffffffffffee0);
      paVar3 = &local_61;
      local_20 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"end of map not found",paVar3);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 (string *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      local_62 = 0;
      __cxa_throw(uVar2,&ParserException::typeinfo,ParserException::~ParserException);
    }
    Scanner::peek((Scanner *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    Token::Token(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (((local_bc != 0xe) && (local_bc != 0xf)) && (local_bc != 6)) break;
    if (local_bc == 6) {
      Scanner::pop((Scanner *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      local_e8 = 3;
    }
    else {
      if (local_bc == 0xe) {
        Scanner::pop((Scanner *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        HandleNode((SingleDocParser *)
                   token.params.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (EventHandler *)
                   token.params.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        (**(code **)(*local_10 + 0x20))(local_10,&local_b8,0);
      }
      in_stack_fffffffffffffed7 =
           Scanner::empty((Scanner *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      if (((bool)in_stack_fffffffffffffed7) ||
         (in_stack_fffffffffffffec8 =
               Scanner::peek((Scanner *)
                             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)),
         in_stack_fffffffffffffec8->type != VALUE)) {
        (**(code **)(*local_10 + 0x20))(local_10,&local_b8,0);
      }
      else {
        Scanner::pop((Scanner *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        HandleNode((SingleDocParser *)
                   token.params.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (EventHandler *)
                   token.params.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_e8 = 0;
    }
    Token::~Token((Token *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    type = (value)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    if (local_e8 != 0) {
      std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::
      operator->((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
                 0xf26848);
      CollectionStack::PopCollectionType
                ((CollectionStack *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 type);
      return;
    }
  }
  mark_ = (Mark *)__cxa_allocate_exception(0x40);
  this_00 = &local_b8;
  paVar3 = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"end of map not found",paVar3);
  ParserException::ParserException
            (this_00,mark_,(string *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  __cxa_throw(mark_,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

void SingleDocParser::HandleBlockMap(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::BlockMap);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP);

    Token token = m_scanner.peek();
    if (token.type != Token::KEY && token.type != Token::VALUE &&
        token.type != Token::BLOCK_MAP_END)
      throw ParserException(token.mark, ErrorMsg::END_OF_MAP);

    if (token.type == Token::BLOCK_MAP_END) {
      m_scanner.pop();
      break;
    }

    // grab key (if non-null)
    if (token.type == Token::KEY) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(token.mark, NullAnchor);
    }

    // now grab value (optional)
    if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(token.mark, NullAnchor);
    }
  }

  m_pCollectionStack->PopCollectionType(CollectionType::BlockMap);
}